

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O3

void collect_mv_stats_b(MV_STATS *mv_stats,AV1_COMP *cpi,int mi_row,int mi_col)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO_EXT_FRAME *pMVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  bool bVar7;
  long lVar8;
  byte bVar9;
  int_mv *piVar10;
  uint8_t *puVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint8_t *puVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  int col;
  ulong uVar23;
  int col_1;
  uint uVar24;
  uint uVar25;
  bool bVar26;
  
  if ((mi_row < (cpi->common).mi_params.mi_rows) && (mi_col < (cpi->common).mi_params.mi_cols)) {
    pMVar4 = (cpi->common).mi_params.mi_grid_base
             [(cpi->common).mi_params.mi_stride * mi_row + mi_col];
    iVar13 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [(cpi->common).mi_params.mi_alloc_bsize]) *
             (cpi->mbmi_ext_info).stride +
             mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [(cpi->common).mi_params.mi_alloc_bsize];
    pMVar5 = (cpi->mbmi_ext_info).frame_base;
    if (((pMVar4->field_0xa7 & 0x80) == 0) && (pMVar4->ref_frame[0] < '\x01')) {
      mv_stats->intra_count = mv_stats->intra_count + 1;
    }
    else {
      mv_stats->inter_count = mv_stats->inter_count + 1;
      bVar1 = pMVar4->mode;
      cVar2 = pMVar4->ref_frame[1];
      if ((bVar1 & 0xf7) == 0x10) {
        bVar26 = true;
        lVar8 = 0;
        do {
          uVar14 = (*(ushort *)&pMVar4->field_0xa7 >> 4 & 3) +
                   (uint)((byte)(pMVar4->mode - 0x15) < 2);
          bVar1 = pMVar4->ref_frame[1];
          cVar3 = pMVar4->ref_frame[0];
          if ((char)bVar1 < '\x01') {
            piVar10 = pMVar5[iVar13].global_mvs + cVar3;
            if (uVar14 < pMVar5[iVar13].ref_mv_count) {
              piVar10 = &pMVar5[iVar13].ref_mv_stack[uVar14].this_mv;
            }
          }
          else {
            if (bVar1 < 5 || '\x04' < cVar3) {
              lVar15 = 0;
              do {
                if ((cVar3 == (&comp_ref0_lut)[lVar15]) && (bVar1 == (&comp_ref1_lut)[lVar15]))
                break;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 9);
            }
            piVar10 = &pMVar5[iVar13].ref_mv_stack[uVar14].comp_mv;
            if (bVar26) {
              piVar10 = &pMVar5[iVar13].ref_mv_stack[uVar14].this_mv;
            }
          }
          keep_one_mv_stat(mv_stats,(MV *)(ulong)piVar10->as_int,
                           (MV *)(ulong)(piVar10->as_int >> 0x10),
                           (AV1_COMP *)(ulong)pMVar4->mv[lVar8].as_int);
          lVar8 = 1;
          bVar7 = (bool)(bVar26 & '\0' < cVar2);
          bVar26 = false;
        } while (bVar7);
      }
      else {
        bVar26 = (bVar1 - 0x13 & 0xfd) == 0;
        if ((byte)(bVar1 - 0x13) < 4) {
          mv_stats->default_mvs = mv_stats->default_mvs + 1;
          uVar14 = (*(ushort *)&pMVar4->field_0xa7 >> 4 & 3) + (uint)((byte)(bVar1 - 0x15) < 2);
          bVar1 = pMVar4->ref_frame[1];
          cVar2 = pMVar4->ref_frame[0];
          if ((char)bVar1 < '\x01') {
            piVar10 = pMVar5[iVar13].global_mvs + cVar2;
            if (uVar14 < pMVar5[iVar13].ref_mv_count) {
              piVar10 = &pMVar5[iVar13].ref_mv_stack[uVar14].this_mv;
            }
          }
          else {
            if (bVar1 < 5 || '\x04' < cVar2) {
              lVar8 = 0;
              do {
                if ((cVar2 == (&comp_ref0_lut)[lVar8]) && (bVar1 == (&comp_ref1_lut)[lVar8])) break;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 9);
            }
            piVar10 = &pMVar5[iVar13].ref_mv_stack[uVar14].this_mv;
            if (bVar26) {
              piVar10 = &pMVar5[iVar13].ref_mv_stack[uVar14].comp_mv;
            }
          }
          keep_one_mv_stat(mv_stats,(MV *)(ulong)piVar10->as_int,
                           (MV *)(ulong)(piVar10->as_int >> 0x10),
                           (AV1_COMP *)(ulong)pMVar4->mv[bVar26].as_int);
        }
        else {
          mv_stats->default_mvs = (uint)('\0' < cVar2) + mv_stats->default_mvs + 1;
        }
      }
      bVar1 = block_size_high[pMVar4->bsize];
      pYVar6 = cpi->source;
      iVar13 = (pYVar6->field_4).field_0.y_stride;
      lVar8 = (long)iVar13;
      iVar17 = mi_col << 2;
      puVar19 = (pYVar6->field_5).buffers[0];
      if ((pYVar6->flags & 8) == 0) {
        lVar15 = (long)mi_row * 4 * lVar8;
        uVar14 = (uint)block_size_wide[pMVar4->bsize];
        if (uVar14 < 3) {
          uVar14 = 2;
        }
        uVar12 = 2;
        if (2 < bVar1) {
          uVar12 = (uint)bVar1;
        }
        puVar11 = puVar19 + lVar15 + lVar8 + iVar17;
        iVar13 = mv_stats->horz_text;
        iVar16 = mv_stats->vert_text;
        iVar18 = mv_stats->diag_text;
        puVar19 = puVar19 + lVar15 + iVar17 + 1;
        uVar21 = 0;
        do {
          uVar23 = 0;
          do {
            uVar24 = (uint)puVar19[uVar23] - (uint)puVar19[uVar23 - 1];
            uVar22 = -uVar24;
            if (0 < (int)uVar24) {
              uVar22 = uVar24;
            }
            uVar25 = (uint)puVar11[uVar23] - (uint)puVar19[uVar23 - 1];
            uVar24 = -uVar25;
            if (0 < (int)uVar25) {
              uVar24 = uVar25;
            }
            iVar13 = iVar13 + (uVar22 & 0xff);
            mv_stats->horz_text = iVar13;
            iVar16 = iVar16 + (uVar24 & 0xff);
            mv_stats->vert_text = iVar16;
            iVar18 = iVar18 + (uVar24 & 0xff) * (uVar22 & 0xff);
            mv_stats->diag_text = iVar18;
            uVar23 = uVar23 + 1;
          } while (uVar14 - 1 != uVar23);
          uVar21 = uVar21 + 1;
          puVar11 = puVar11 + lVar8;
          puVar19 = puVar19 + lVar8;
        } while (uVar21 != uVar12 - 1);
      }
      else {
        lVar15 = (long)((int)((long)mi_row * 4) * iVar13);
        bVar9 = (char)((cpi->common).seq_params)->bit_depth - 8;
        uVar14 = (uint)block_size_wide[pMVar4->bsize];
        if (uVar14 < 3) {
          uVar14 = 2;
        }
        uVar12 = 2;
        if (2 < bVar1) {
          uVar12 = (uint)bVar1;
        }
        lVar20 = lVar15 * 2 + (long)puVar19 * 2 + (long)iVar17 * 2 + lVar8 * 2;
        iVar13 = mv_stats->horz_text;
        iVar16 = mv_stats->vert_text;
        iVar18 = mv_stats->diag_text;
        lVar15 = (long)iVar17 * 2 + lVar15 * 2 + (long)puVar19 * 2 + 2;
        uVar21 = 0;
        do {
          uVar23 = 0;
          do {
            uVar25 = (uint)*(ushort *)(lVar15 + -2 + uVar23 * 2);
            uVar24 = *(ushort *)(lVar15 + uVar23 * 2) - uVar25;
            uVar22 = -uVar24;
            if (0 < (int)uVar24) {
              uVar22 = uVar24;
            }
            uVar24 = (uVar22 & 0xffff) >> (bVar9 & 0x1f);
            uVar25 = *(ushort *)(lVar20 + uVar23 * 2) - uVar25;
            uVar22 = -uVar25;
            if (0 < (int)uVar25) {
              uVar22 = uVar25;
            }
            uVar22 = (uVar22 & 0xffff) >> (bVar9 & 0x1f);
            iVar13 = iVar13 + uVar24;
            iVar16 = iVar16 + uVar22;
            iVar18 = iVar18 + uVar22 * uVar24;
            uVar23 = uVar23 + 1;
          } while (uVar14 - 1 != uVar23);
          uVar21 = uVar21 + 1;
          lVar20 = lVar20 + lVar8 * 2;
          lVar15 = lVar15 + lVar8 * 2;
        } while (uVar21 != uVar12 - 1);
        mv_stats->horz_text = iVar13;
        mv_stats->vert_text = iVar16;
        mv_stats->diag_text = iVar18;
      }
    }
  }
  return;
}

Assistant:

static inline void collect_mv_stats_b(MV_STATS *mv_stats, const AV1_COMP *cpi,
                                      int mi_row, int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) {
    return;
  }

  const MB_MODE_INFO *mbmi =
      mi_params->mi_grid_base[mi_row * mi_params->mi_stride + mi_col];
  const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame =
      cpi->mbmi_ext_info.frame_base +
      get_mi_ext_idx(mi_row, mi_col, cm->mi_params.mi_alloc_bsize,
                     cpi->mbmi_ext_info.stride);

  if (!is_inter_block(mbmi)) {
    mv_stats->intra_count++;
    return;
  }
  mv_stats->inter_count++;

  const PREDICTION_MODE mode = mbmi->mode;
  const int is_compound = has_second_ref(mbmi);

  if (mode == NEWMV || mode == NEW_NEWMV) {
    // All mvs are new
    for (int ref_idx = 0; ref_idx < 1 + is_compound; ++ref_idx) {
      const MV ref_mv =
          get_ref_mv_for_mv_stats(mbmi, mbmi_ext_frame, ref_idx).as_mv;
      const MV cur_mv = mbmi->mv[ref_idx].as_mv;
      keep_one_mv_stat(mv_stats, &ref_mv, &cur_mv, cpi);
    }
  } else if (mode == NEAREST_NEWMV || mode == NEAR_NEWMV ||
             mode == NEW_NEARESTMV || mode == NEW_NEARMV) {
    // has exactly one new_mv
    mv_stats->default_mvs += 1;

    const int ref_idx = (mode == NEAREST_NEWMV || mode == NEAR_NEWMV);
    const MV ref_mv =
        get_ref_mv_for_mv_stats(mbmi, mbmi_ext_frame, ref_idx).as_mv;
    const MV cur_mv = mbmi->mv[ref_idx].as_mv;

    keep_one_mv_stat(mv_stats, &ref_mv, &cur_mv, cpi);
  } else {
    // No new_mv
    mv_stats->default_mvs += 1 + is_compound;
  }

  // Add texture information
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int num_rows = block_size_high[bsize];
  const int num_cols = block_size_wide[bsize];
  const int y_stride = cpi->source->y_stride;
  const int px_row = 4 * mi_row, px_col = 4 * mi_col;
  const int buf_is_hbd = cpi->source->flags & YV12_FLAG_HIGHBITDEPTH;
  const int bd = cm->seq_params->bit_depth;
  if (buf_is_hbd) {
    uint16_t *source_buf =
        CONVERT_TO_SHORTPTR(cpi->source->y_buffer) + px_row * y_stride + px_col;
    for (int row = 0; row < num_rows - 1; row++) {
      for (int col = 0; col < num_cols - 1; col++) {
        const int offset = row * y_stride + col;
        const int horz_diff =
            abs(source_buf[offset + 1] - source_buf[offset]) >> (bd - 8);
        const int vert_diff =
            abs(source_buf[offset + y_stride] - source_buf[offset]) >> (bd - 8);
        mv_stats->horz_text += horz_diff;
        mv_stats->vert_text += vert_diff;
        mv_stats->diag_text += horz_diff * vert_diff;
      }
    }
  } else {
    uint8_t *source_buf = cpi->source->y_buffer + px_row * y_stride + px_col;
    for (int row = 0; row < num_rows - 1; row++) {
      for (int col = 0; col < num_cols - 1; col++) {
        const int offset = row * y_stride + col;
        const int horz_diff = abs(source_buf[offset + 1] - source_buf[offset]);
        const int vert_diff =
            abs(source_buf[offset + y_stride] - source_buf[offset]);
        mv_stats->horz_text += horz_diff;
        mv_stats->vert_text += vert_diff;
        mv_stats->diag_text += horz_diff * vert_diff;
      }
    }
  }
}